

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTetrahedronFace.h
# Opt level: O2

void __thiscall
chrono::fea::ChTetrahedronFace::LoadableGetVariables
          (ChTetrahedronFace *this,
          vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *mvars)

{
  int iVar1;
  ChVariables *local_48;
  ChLoadableUV local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  for (iVar1 = 0; iVar1 != 3; iVar1 = iVar1 + 1) {
    GetNodeN((ChTetrahedronFace *)&local_40,(int)this);
    local_48 = (ChVariables *)(**(code **)(*(long *)local_40 + 0x40))();
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    emplace_back<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,&local_48)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  return;
}

Assistant:

virtual void LoadableGetVariables(std::vector<ChVariables*>& mvars) override {
        for (int i = 0; i < 3; ++i)
            mvars.push_back(&GetNodeN(i)->Variables());
    }